

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigManager.cpp
# Opt level: O0

ChannelController *
anon_unknown.dwarf_33c44e::make_basic_channel_controller
          (char *name,config_map_t *initial_cfg,Options *opts)

{
  ChannelController *this;
  Options *opts_local;
  config_map_t *initial_cfg_local;
  char *name_local;
  
  this = (ChannelController *)operator_new(0x18);
  (anonymous_namespace)::make_basic_channel_controller(char_const*,std::map<std::__cxx11::string,std
  ::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::
  string_const,std::__cxx11::string>>>const&,cali::ConfigManager::Options_const&)::BasicController::
  BasicController(char_const*,std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::
  __cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::
  string>>>const&,cali::ConfigManager::Options_const__(this,name,initial_cfg,opts);
  return this;
}

Assistant:

ChannelController* make_basic_channel_controller(
    const char*                   name,
    const config_map_t&           initial_cfg,
    const ConfigManager::Options& opts
)
{
    class BasicController : public ChannelController
    {
    public:

        BasicController(const char* name, const config_map_t& initial_cfg, const ConfigManager::Options& opts)
            : ChannelController(name, 0, initial_cfg)
        {
            // Hacky way to handle "output" option
            if (opts.is_set("output")) {
                std::string output = opts.get("output");

                config()["CALI_RECORDER_FILENAME"]  = output;
                config()["CALI_REPORT_FILENAME"]    = output;
                config()["CALI_MPIREPORT_FILENAME"] = output;
            }

            opts.update_channel_config(config());
            opts.update_channel_metadata(metadata());
        }
    };

    return new BasicController(name, initial_cfg, opts);
}